

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (observation <= 0.0) {
    RVar3 = 3;
  }
  else {
    uVar4 = -(ulong)(observation < ref_histogram->max);
    uVar5 = -(ulong)(ref_histogram->min < observation);
    ref_histogram->max = (REF_DBL)(~uVar4 & (ulong)observation | (ulong)ref_histogram->max & uVar4);
    ref_histogram->min = (REF_DBL)(~uVar5 & (ulong)observation | (ulong)ref_histogram->min & uVar5);
    dVar6 = log2(observation);
    ref_histogram->log_total = dVar6 + ref_histogram->log_total;
    uVar1 = ref_histogram_to_bin(ref_histogram,observation);
    uVar2 = ref_histogram->nbin - 1;
    if ((int)uVar1 < (int)uVar2) {
      uVar2 = uVar1;
    }
    RVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = 0;
    }
    ref_histogram->bins[uVar4] = ref_histogram->bins[uVar4] + 1;
    if ((FILE *)ref_histogram->df != (FILE *)0x0) {
      fprintf((FILE *)ref_histogram->df,"%f\n",observation);
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,
                                     REF_DBL observation) {
  REF_INT i;

  if (observation <= 0.0) return REF_INVALID;

  ref_histogram_max(ref_histogram) =
      MAX(ref_histogram_max(ref_histogram), observation);
  ref_histogram_min(ref_histogram) =
      MIN(ref_histogram_min(ref_histogram), observation);
  ref_histogram_log_total(ref_histogram) += log2(observation);

  i = ref_histogram_to_bin(ref_histogram, observation);
  i = MIN(i, ref_histogram_nbin(ref_histogram) - 1);
  i = MAX(i, 0);

  ref_histogram_bin(ref_histogram, i)++;

  if (NULL != ref_histogram->df)
    fprintf(ref_histogram->df, "%f\n", observation);

  return REF_SUCCESS;
}